

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O1

SDKConnection * __thiscall MyServer::OnIncomingConnection(MyServer *this,TonkAddress *address)

{
  MyServerConnection *pMVar1;
  shared_ptr<MyServerConnection> ptr;
  undefined1 local_29;
  MyServerConnection *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  MyServer *local_18;
  
  local_28 = (MyServerConnection *)0x0;
  local_18 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyServerConnection,std::allocator<MyServerConnection>,MyServer*>
            (&local_20,&local_28,(allocator<MyServerConnection> *)&local_29,&local_18);
  std::__shared_ptr<MyServerConnection,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<MyServerConnection,MyServerConnection>
            ((__shared_ptr<MyServerConnection,(__gnu_cxx::_Lock_policy)2> *)&local_28,local_28);
  tonk::SDKConnectionList<MyServerConnection>::Insert
            (&this->ConnectionList,&local_28->super_SDKConnection);
  pMVar1 = local_28;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return &pMVar1->super_SDKConnection;
}

Assistant:

tonk::SDKConnection* MyServer::OnIncomingConnection(
    const TonkAddress& address ///< Address of the client requesting a connection
)
{
    auto ptr = std::make_shared<MyServerConnection>(this);

    // Insert into connection list to prevent it from going out of scope
    ConnectionList.Insert(ptr.get());

    return ptr.get();
}